

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O0

void helper_gvec_shr32i_mips64(void *d,void *a,uint32_t desc)

{
  int32_t iVar1;
  intptr_t oprsz_00;
  undefined8 local_38;
  intptr_t i;
  int shift;
  intptr_t oprsz;
  uint32_t desc_local;
  void *a_local;
  void *d_local;
  
  oprsz_00 = simd_oprsz(desc);
  iVar1 = simd_data(desc);
  for (local_38 = 0; local_38 < oprsz_00; local_38 = local_38 + 4) {
    *(uint *)((long)d + local_38) = *(uint *)((long)a + local_38) >> ((byte)iVar1 & 0x1f);
  }
  clear_high(d,oprsz_00,desc);
  return;
}

Assistant:

void HELPER(gvec_shr32i)(void *d, void *a, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    int shift = simd_data(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint32_t)) {
        *(uint32_t *)((char *)d + i) = *(uint32_t *)((char *)a + i) >> shift;
    }
    clear_high(d, oprsz, desc);
}